

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O0

int ffclos(fitsfile *fptr,int *status)

{
  int iVar1;
  int *in_RSI;
  fitsfile *in_RDI;
  int zerostatus;
  int tstatus;
  int *in_stack_00000038;
  fitsfile *in_stack_00000040;
  undefined4 uVar2;
  undefined4 uVar3;
  int local_4;
  
  uVar3 = 999;
  uVar2 = 0;
  if (in_RDI == (fitsfile *)0x0) {
    *in_RSI = 0x73;
    local_4 = 0x73;
  }
  else if (in_RDI->Fptr->validcode == 0x22b) {
    if (*in_RSI < 1) {
      ffchdu(in_stack_00000040,in_stack_00000038);
    }
    else {
      ffchdu(in_stack_00000040,in_stack_00000038);
    }
    in_RDI->Fptr->open_count = in_RDI->Fptr->open_count + -1;
    iVar1 = (int)((ulong)in_RSI >> 0x20);
    if (in_RDI->Fptr->open_count == 0) {
      ffflsh(in_RDI,iVar1,(int *)CONCAT44(uVar3,uVar2));
      iVar1 = (*driverTable[in_RDI->Fptr->driver].close)(in_RDI->Fptr->filehandle);
      if ((iVar1 != 0) && (*in_RSI < 1)) {
        *in_RSI = 0x6e;
        ffpmsg((char *)0x108c62);
        ffpmsg((char *)0x108c74);
      }
      fits_clear_Fptr(in_RDI->Fptr,in_RSI);
      free(in_RDI->Fptr->iobuffer);
      free(in_RDI->Fptr->headstart);
      free(in_RDI->Fptr->filename);
      in_RDI->Fptr->filename = (char *)0x0;
      in_RDI->Fptr->validcode = 0;
      free(in_RDI->Fptr);
      free(in_RDI);
    }
    else {
      if (*in_RSI < 1) {
        ffflsh(in_RDI,iVar1,(int *)CONCAT44(uVar3,uVar2));
      }
      else {
        ffflsh(in_RDI,iVar1,(int *)CONCAT44(uVar3,uVar2));
      }
      free(in_RDI);
    }
    local_4 = *in_RSI;
  }
  else {
    *in_RSI = 0x72;
    local_4 = 0x72;
  }
  return local_4;
}

Assistant:

int ffclos(fitsfile *fptr,      /* I - FITS file pointer */
           int *status)         /* IO - error status     */
/*
  close the FITS file by completing the current HDU, flushing it to disk,
  then calling the system dependent routine to physically close the FITS file
*/   
{
    int tstatus = NO_CLOSE_ERROR, zerostatus = 0;

    if (!fptr)
        return(*status = NULL_INPUT_PTR);
    else if ((fptr->Fptr)->validcode != VALIDSTRUC) /* check for magic value */
        return(*status = BAD_FILEPTR); 

    /* close and flush the current HDU */
    if (*status > 0)
       ffchdu(fptr, &tstatus);  /* turn off the error message from ffchdu */
    else
       ffchdu(fptr, status);         

    ((fptr->Fptr)->open_count)--;           /* decrement usage counter */

    if ((fptr->Fptr)->open_count == 0)  /* if no other files use structure */
    {
        ffflsh(fptr, TRUE, status);   /* flush and disassociate IO buffers */

        /* call driver function to actually close the file */
        if ((*driverTable[(fptr->Fptr)->driver].close)((fptr->Fptr)->filehandle))
        {
            if (*status <= 0)
            {
              *status = FILE_NOT_CLOSED;  /* report if no previous error */

              ffpmsg("failed to close the following file: (ffclos)");
              ffpmsg((fptr->Fptr)->filename);
            }
        }

        fits_clear_Fptr( fptr->Fptr, status);  /* clear Fptr address */
        free((fptr->Fptr)->iobuffer);    /* free memory for I/O buffers */
        free((fptr->Fptr)->headstart);    /* free memory for headstart array */
        free((fptr->Fptr)->filename);     /* free memory for the filename */
        (fptr->Fptr)->filename = 0;
        (fptr->Fptr)->validcode = 0; /* magic value to indicate invalid fptr */
        free(fptr->Fptr);         /* free memory for the FITS file structure */
        free(fptr);               /* free memory for the FITS file structure */
    }
    else
    {
        /*
           to minimize the fallout from any previous error (e.g., trying to 
           open a non-existent extension in a already opened file), 
           always call ffflsh with status = 0.
        */
        /* just flush the buffers, don't disassociate them */
        if (*status > 0)
            ffflsh(fptr, FALSE, &zerostatus); 
        else
            ffflsh(fptr, FALSE, status); 

        free(fptr);               /* free memory for the FITS file structure */
    }

    return(*status);
}